

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O0

void __thiscall
TStokesAnalytic::uxy<Fad<double>>
          (TStokesAnalytic *this,TPZVec<Fad<double>_> *x,TPZVec<Fad<double>_> *flux)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  TPZVec<Fad<double>_> *in_RDX;
  TPZVec<Fad<double>_> *in_RSI;
  long in_RDI;
  double dVar4;
  Fad<double> *pFVar5;
  FadExpr<FadFuncSin<Fad<double>_>_> *w;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>_>_>
  *fadexpr;
  FadExpr<FadFuncCos<Fad<double>_>_> *expr;
  REAL xs;
  REAL lambda;
  REAL Re;
  Fad<double> x3;
  Fad<double> x2;
  Fad<double> x1;
  Fad<double> *in_stack_ffffffffffffe968;
  Fad<double> *in_stack_ffffffffffffe970;
  Fad<double> *in_stack_ffffffffffffe978;
  Fad<double> *in_stack_ffffffffffffe980;
  FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>_>_>
  *in_stack_ffffffffffffe988;
  Fad<double> *in_stack_ffffffffffffe990;
  Fad<double> *pFVar6;
  FadExpr<FadUnaryMin<Fad<double>_>_> *in_stack_ffffffffffffe998;
  FadExpr<FadFuncSin<Fad<double>_>_> *in_stack_ffffffffffffe9a0;
  undefined7 in_stack_ffffffffffffe9a8;
  undefined1 in_stack_ffffffffffffe9af;
  Fad<double> *in_stack_ffffffffffffe9b0;
  undefined7 in_stack_ffffffffffffe9b8;
  undefined1 in_stack_ffffffffffffe9bf;
  double in_stack_ffffffffffffe9c0;
  Fad<double> *in_stack_ffffffffffffe9c8;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
  *e;
  size_t in_stack_ffffffffffffed88;
  char *in_stack_ffffffffffffed90;
  
  TPZVec<Fad<double>_>::operator[](in_RSI,0);
  Fad<double>::Fad(in_stack_ffffffffffffe980,in_stack_ffffffffffffe978);
  TPZVec<Fad<double>_>::operator[](in_RSI,1);
  Fad<double>::Fad(in_stack_ffffffffffffe980,in_stack_ffffffffffffe978);
  TPZVec<Fad<double>_>::operator[](in_RSI,2);
  Fad<double>::Fad(in_stack_ffffffffffffe980,in_stack_ffffffffffffe978);
  switch(*(undefined4 *)(in_RDI + 0x14)) {
  case 2:
  case 3:
    dVar4 = 1.0 / *(double *)(in_RDI + 0x18);
    in_stack_ffffffffffffe970 = (Fad<double> *)(dVar4 * 0.5);
    sqrt(*(double *)(in_RDI + 0x28) * 4.0 * *(double *)(in_RDI + 0x28) + dVar4 * dVar4 * 0.25);
    operator*<double,_Fad<double>,_nullptr>
              ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
               in_stack_ffffffffffffe9b0);
    exp<FadBinaryMul<FadCst<double>,Fad<double>>>
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<double,_Fad<double>,_nullptr>
              ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
               in_stack_ffffffffffffe9b0);
    cos<FadBinaryMul<FadCst<double>,Fad<double>>>
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
               (FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffe9a0);
    operator-<double,_FadExpr<FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_nullptr>
              ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
               (FadExpr<FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe9b0);
    TPZVec<Fad<double>_>::operator[](in_RDX,0);
    Fad<double>::operator=(in_stack_ffffffffffffe990,in_stack_ffffffffffffe988);
    FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>::~FadExpr
              ((FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>::~FadExpr
              ((FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe970);
    operator*<double,_Fad<double>,_nullptr>
              ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
               in_stack_ffffffffffffe9b0);
    exp<FadBinaryMul<FadCst<double>,Fad<double>>>
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<double,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_nullptr>
              ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
               (FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffe9b0);
    operator*<double,_Fad<double>,_nullptr>
              ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
               in_stack_ffffffffffffe9b0);
    sin<FadBinaryMul<FadCst<double>,Fad<double>>>
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
               (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffe9a0);
    TPZVec<Fad<double>_>::operator[](in_RDX,1);
    Fad<double>::operator=
              (in_stack_ffffffffffffe990,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe988);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>::~FadExpr
              ((FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>::~FadExpr
              ((FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe970);
    break;
  case 4:
    sin<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<double,_FadExpr<FadFuncSin<Fad<double>_>_>,_nullptr>
              ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
               (FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_ffffffffffffe9b0);
    sin<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
               in_stack_ffffffffffffe9a0);
    TPZVec<Fad<double>_>::operator[](in_RDX,0);
    Fad<double>::operator=
              (in_stack_ffffffffffffe990,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffe988);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncSin<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffe970);
    FadExpr<FadFuncSin<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    cos<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<double,_FadExpr<FadFuncCos<Fad<double>_>_>,_nullptr>
              ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
               (FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe9b0);
    cos<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
               (FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe9a0);
    TPZVec<Fad<double>_>::operator[](in_RDX,1);
    Fad<double>::operator=
              (in_stack_ffffffffffffe990,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffe988);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncCos<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffe970);
    FadExpr<FadFuncCos<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    break;
  case 5:
    operator*<Fad<double>,_double,_nullptr>(in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
    TPZVec<Fad<double>_>::operator[](in_RDX,0);
    Fad<double>::operator=
              (in_stack_ffffffffffffe990,
               (FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *)in_stack_ffffffffffffe988);
    FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *)in_stack_ffffffffffffe970);
    operator*<Fad<double>,_double,_nullptr>(in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
    TPZVec<Fad<double>_>::operator[](in_RDX,1);
    Fad<double>::operator=
              (in_stack_ffffffffffffe990,
               (FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *)in_stack_ffffffffffffe988);
    FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *)in_stack_ffffffffffffe970);
    break;
  case 6:
    sin<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    ::operator-((FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_ffffffffffffe978);
    sin<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<FadExpr<FadUnaryMin<FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>,_nullptr>
              ((FadExpr<FadUnaryMin<FadExpr<FadFuncSin<Fad<double>_>_>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
               in_stack_ffffffffffffe9a0);
    TPZVec<Fad<double>_>::operator[](in_RDX,0);
    Fad<double>::operator=
              (in_stack_ffffffffffffe990,
               (FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffe988);
    FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncSin<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadUnaryMin<FadExpr<FadFuncSin<Fad<double>_>_>_>_>::~FadExpr
              ((FadExpr<FadUnaryMin<FadExpr<FadFuncSin<Fad<double>_>_>_>_> *)0x1ea63e9);
    FadExpr<FadFuncSin<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    cos<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    ::operator-((FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe978);
    cos<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>,_nullptr>
              ((FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
               (FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe9a0);
    sin<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    sin<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>,_nullptr>
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
               in_stack_ffffffffffffe9a0);
    operator-<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
               (FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffe9a0);
    TPZVec<Fad<double>_>::operator[](in_RDX,1);
    Fad<double>::operator=
              (in_stack_ffffffffffffe990,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe988);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncSin<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncSin<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncCos<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>::~FadExpr
              ((FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_> *)0x1ea6545);
    FadExpr<FadFuncCos<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    cos<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    ::operator-((FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe978);
    cos<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>,_nullptr>
              ((FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
               (FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe9a0);
    TPZVec<Fad<double>_>::operator[](in_RDX,2);
    Fad<double>::operator=
              (in_stack_ffffffffffffe990,
               (FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffe988);
    FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncCos<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>::~FadExpr
              ((FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_> *)0x1ea6601);
    FadExpr<FadFuncCos<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    break;
  case 7:
    TPZVec<Fad<double>_>::operator[](in_RDX,0);
    Fad<double>::operator=(in_stack_ffffffffffffe970,in_stack_ffffffffffffe968);
    Fad<double>::operator-(in_stack_ffffffffffffe978);
    TPZVec<Fad<double>_>::operator[](in_RDX,1);
    Fad<double>::operator=
              (in_stack_ffffffffffffe990,
               (FadExpr<FadUnaryMin<Fad<double>_>_> *)in_stack_ffffffffffffe988);
    FadExpr<FadUnaryMin<Fad<double>_>_>::~FadExpr((FadExpr<FadUnaryMin<Fad<double>_>_> *)0x1ea6d6a);
    break;
  default:
    pzinternal::DebugStopImpl(in_stack_ffffffffffffed90,in_stack_ffffffffffffed88);
    break;
  case 10:
    ::exp(*(double *)(in_RDI + 0x30) / *(double *)(in_RDI + 0x18));
    sin<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<double,_FadExpr<FadFuncSin<Fad<double>_>_>,_nullptr>
              ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
               (FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_ffffffffffffe9b0);
    sin<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
               in_stack_ffffffffffffe9a0);
    sin<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<double,_FadExpr<FadFuncSin<Fad<double>_>_>,_nullptr>
              ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
               (FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_ffffffffffffe9b0);
    sin<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
               in_stack_ffffffffffffe9a0);
    operator+<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffe9a0);
    TPZVec<Fad<double>_>::operator[](in_RDX,0);
    Fad<double>::operator=
              (in_stack_ffffffffffffe990,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe988);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncSin<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffe970);
    FadExpr<FadFuncSin<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncSin<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffe970);
    FadExpr<FadFuncSin<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    cos<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<double,_FadExpr<FadFuncCos<Fad<double>_>_>,_nullptr>
              ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
               (FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe9b0);
    cos<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
               (FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe9a0);
    cos<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<double,_FadExpr<FadFuncCos<Fad<double>_>_>,_nullptr>
              ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
               (FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe9b0);
    cos<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
               (FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe9a0);
    operator-<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffe9a0);
    TPZVec<Fad<double>_>::operator[](in_RDX,1);
    Fad<double>::operator=
              (in_stack_ffffffffffffe990,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe988);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncCos<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffe970);
    FadExpr<FadFuncCos<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncCos<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffe970);
    FadExpr<FadFuncCos<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    break;
  case 0xb:
    dVar4 = ::exp(*(double *)(in_RDI + 0x30) / *(double *)(in_RDI + 0x18));
    pFVar5 = (Fad<double> *)(1.0 / dVar4);
    w = (FadExpr<FadFuncSin<Fad<double>_>_> *)-(double)pFVar5;
    sin<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<double,_FadExpr<FadFuncSin<Fad<double>_>_>,_nullptr>
              ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
               (FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_ffffffffffffe9b0);
    sin<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),w);
    sin<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<double,_FadExpr<FadFuncSin<Fad<double>_>_>,_nullptr>
              ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
               (FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_ffffffffffffe9b0);
    sin<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),w);
    operator+<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                *)w);
    TPZVec<Fad<double>_>::operator[](in_RDX,0);
    Fad<double>::operator=
              (in_stack_ffffffffffffe990,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe988);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncSin<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffe970);
    FadExpr<FadFuncSin<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncSin<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffe970);
    FadExpr<FadFuncSin<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    pFVar6 = pFVar5;
    cos<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    ::operator-((FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe978);
    cos<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>,_nullptr>
              ((FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
               (FadExpr<FadFuncCos<Fad<double>_>_> *)w);
    sin<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    sin<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>,_nullptr>
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),w);
    operator-<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
               (FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                *)w);
    operator*<double,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>,_nullptr>
              ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe9b0);
    fadexpr = (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>_>_>
               *)(1.0 - (double)pFVar5);
    cos<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    ::operator-((FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe978);
    cos<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>,_nullptr>
              ((FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
               (FadExpr<FadFuncCos<Fad<double>_>_> *)w);
    sin<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    sin<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>,_nullptr>
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),w);
    operator+<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
               (FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                *)w);
    operator*<double,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>,_nullptr>
              ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe9b0);
    operator+<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>
                *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
               (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>
                *)w);
    TPZVec<Fad<double>_>::operator[](in_RDX,1);
    Fad<double>::operator=(pFVar6,fadexpr);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncSin<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncSin<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncCos<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>::~FadExpr
              ((FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_> *)0x1ea530a);
    FadExpr<FadFuncCos<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadFuncSin<Fad<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncSin<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncSin<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncCos<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>::~FadExpr
              ((FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_> *)0x1ea537f);
    FadExpr<FadFuncCos<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    cos<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<double,_FadExpr<FadFuncCos<Fad<double>_>_>,_nullptr>
              ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
               (FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe9b0);
    cos<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
               (FadExpr<FadFuncCos<Fad<double>_>_> *)w);
    expr = (FadExpr<FadFuncCos<Fad<double>_>_> *)(1.0 - (double)pFVar5);
    cos<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    ::operator-(expr);
    cos<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>,_nullptr>
              ((FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
               (FadExpr<FadFuncCos<Fad<double>_>_> *)w);
    operator*<double,_FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_nullptr>
              ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
               (FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffe9b0);
    operator+<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
               (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>
                *)w);
    TPZVec<Fad<double>_>::operator[](in_RDX,2);
    Fad<double>::operator=
              (pFVar6,(FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>_>_>
                       *)fadexpr);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncCos<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_>::~FadExpr
              ((FadExpr<FadUnaryMin<FadExpr<FadFuncCos<Fad<double>_>_>_>_> *)0x1ea5530);
    FadExpr<FadFuncCos<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncCos<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffe970);
    FadExpr<FadFuncCos<Fad<double>_>_>::~FadExpr
              ((FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe970);
    break;
  case 0xc:
    operator*<double,_Fad<double>,_nullptr>
              ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
               in_stack_ffffffffffffe9b0);
    cos<FadBinaryMul<FadCst<double>,Fad<double>>>
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<double,_Fad<double>,_nullptr>
              ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
               in_stack_ffffffffffffe9b0);
    sin<FadBinaryMul<FadCst<double>,Fad<double>>>
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
               (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffe9a0);
    operator*<double,_Fad<double>,_nullptr>
              ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
               in_stack_ffffffffffffe9b0);
    sin<FadBinaryMul<FadCst<double>,Fad<double>>>
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<FadExpr<FadBinaryMul<FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
               (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffe9a0);
    TPZVec<Fad<double>_>::operator[](in_RDX,0);
    Fad<double>::operator=
              (in_stack_ffffffffffffe990,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe988);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>::~FadExpr
              ((FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>::~FadExpr
              ((FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>::~FadExpr
              ((FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe970);
    operator*<double,_Fad<double>,_nullptr>
              ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
               in_stack_ffffffffffffe9b0);
    sin<FadBinaryMul<FadCst<double>,Fad<double>>>
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<double,_Fad<double>,_nullptr>
              ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
               in_stack_ffffffffffffe9b0);
    cos<FadBinaryMul<FadCst<double>,Fad<double>>>
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
               (FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffe9a0);
    operator*<double,_Fad<double>,_nullptr>
              ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
               in_stack_ffffffffffffe9b0);
    sin<FadBinaryMul<FadCst<double>,Fad<double>>>
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
               (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffe9a0);
    TPZVec<Fad<double>_>::operator[](in_RDX,1);
    Fad<double>::operator=
              (in_stack_ffffffffffffe990,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe988);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>::~FadExpr
              ((FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>::~FadExpr
              ((FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>::~FadExpr
              ((FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe970);
    operator*<double,_Fad<double>,_nullptr>
              ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
               in_stack_ffffffffffffe9b0);
    sin<FadBinaryMul<FadCst<double>,Fad<double>>>
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<double,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_nullptr>
              ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
               (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffe9b0);
    operator*<double,_Fad<double>,_nullptr>
              ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
               in_stack_ffffffffffffe9b0);
    sin<FadBinaryMul<FadCst<double>,Fad<double>>>
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
               (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffe9a0);
    operator*<double,_Fad<double>,_nullptr>
              ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
               in_stack_ffffffffffffe9b0);
    cos<FadBinaryMul<FadCst<double>,Fad<double>>>
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
               CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
    operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
               (FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffe9a0);
    TPZVec<Fad<double>_>::operator[](in_RDX,2);
    Fad<double>::operator=
              (in_stack_ffffffffffffe990,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe988);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>::~FadExpr
              ((FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>::~FadExpr
              ((FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
    ::~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                *)in_stack_ffffffffffffe970);
    FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>::~FadExpr
              ((FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
               in_stack_ffffffffffffe970);
    FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe970);
    break;
  case 0xd:
    bVar1 = operator<<double,_double,_nullptr>
                      (in_stack_ffffffffffffe970,&in_stack_ffffffffffffe968->val_);
    if (bVar1) {
      Fad<double>::operator-(in_stack_ffffffffffffe978);
      exp<FadUnaryMin<Fad<double>>>(in_stack_ffffffffffffe998);
      exp<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
      operator-<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>,_nullptr>
                ((FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_> *)
                 CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
                 (FadExpr<FadFuncExp<Fad<double>_>_> *)in_stack_ffffffffffffe9a0);
      cos<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
      operator*<FadExpr<FadBinaryMinus<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>,_nullptr>
                ((FadExpr<FadBinaryMinus<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>
                  *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
                 (FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe9a0);
      TPZVec<Fad<double>_>::operator[](in_RDX,0);
      Fad<double>::operator=
                (in_stack_ffffffffffffe990,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffe988);
      FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffe970);
      FadExpr<FadFuncCos<Fad<double>_>_>::~FadExpr
                ((FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe970);
      FadExpr<FadBinaryMinus<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffe970);
      FadExpr<FadFuncExp<Fad<double>_>_>::~FadExpr
                ((FadExpr<FadFuncExp<Fad<double>_>_> *)in_stack_ffffffffffffe970);
      FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>::~FadExpr
                ((FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffe970);
      FadExpr<FadUnaryMin<Fad<double>_>_>::~FadExpr
                ((FadExpr<FadUnaryMin<Fad<double>_>_> *)0x1ea3702);
      Fad<double>::operator-(in_stack_ffffffffffffe978);
      exp<FadUnaryMin<Fad<double>>>(in_stack_ffffffffffffe998);
      exp<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
      operator+<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>,_nullptr>
                ((FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_> *)
                 CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
                 (FadExpr<FadFuncExp<Fad<double>_>_> *)in_stack_ffffffffffffe9a0);
      ::operator-((FadExpr<FadBinaryAdd<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>
                   *)in_stack_ffffffffffffe978);
      sin<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
      operator*<FadExpr<FadUnaryMin<FadExpr<FadBinaryAdd<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>,_nullptr>
                ((FadExpr<FadUnaryMin<FadExpr<FadBinaryAdd<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>_>_>
                  *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
                 in_stack_ffffffffffffe9a0);
      TPZVec<Fad<double>_>::operator[](in_RDX,1);
      Fad<double>::operator=
                (in_stack_ffffffffffffe990,
                 (FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryAdd<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffe988);
      FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryAdd<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryAdd<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffe970);
      FadExpr<FadFuncSin<Fad<double>_>_>::~FadExpr
                ((FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_ffffffffffffe970);
      FadExpr<FadUnaryMin<FadExpr<FadBinaryAdd<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>_>_>
      ::~FadExpr((FadExpr<FadUnaryMin<FadExpr<FadBinaryAdd<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>_>_>
                  *)0x1ea37fe);
      FadExpr<FadBinaryAdd<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>
                  *)in_stack_ffffffffffffe970);
      FadExpr<FadFuncExp<Fad<double>_>_>::~FadExpr
                ((FadExpr<FadFuncExp<Fad<double>_>_> *)in_stack_ffffffffffffe970);
      FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>::~FadExpr
                ((FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffe970);
      FadExpr<FadUnaryMin<Fad<double>_>_>::~FadExpr
                ((FadExpr<FadUnaryMin<Fad<double>_>_> *)0x1ea3832);
    }
    else {
      bVar1 = operator>=<double,_double,_nullptr>
                        (in_stack_ffffffffffffe970,&in_stack_ffffffffffffe968->val_);
      if (bVar1) {
        e = (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
             *)(2.0 / *(double *)(in_RDI + 0x28));
        operator*<double,_Fad<double>,_nullptr>
                  ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
                   in_stack_ffffffffffffe9b0);
        sin<FadBinaryMul<FadCst<double>,Fad<double>>>
                  ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
                   CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
        operator*<double,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_nullptr>
                  ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
                   (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffe9b0);
        operator*<double,_Fad<double>,_nullptr>
                  ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
                   in_stack_ffffffffffffe9b0);
        cos<FadBinaryMul<FadCst<double>,Fad<double>>>
                  ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
                   CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
        operator*<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_nullptr>
                  ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                    *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
                   (FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffe9a0);
        cos<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
        operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>,_nullptr>
                  ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                    *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
                   (FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe9a0);
        TPZVec<Fad<double>_>::operator[](in_RDX,0);
        Fad<double>::operator=
                  (in_stack_ffffffffffffe990,
                   (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffe988);
        FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffe970);
        FadExpr<FadFuncCos<Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadFuncCos<Fad<double>_>_> *)in_stack_ffffffffffffe970);
        FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffe970);
        FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>::~FadExpr
                  ((FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffe970);
        FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe970
                  );
        FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffe970);
        FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>::~FadExpr
                  ((FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffe970);
        FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe970
                  );
        dVar4 = 1.0 / (*(double *)(in_RDI + 0x28) * *(double *)(in_RDI + 0x28));
        operator*<double,_Fad<double>,_nullptr>
                  ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
                   in_stack_ffffffffffffe9b0);
        sin<FadBinaryMul<FadCst<double>,Fad<double>>>
                  ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
                   CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
        operator*<double,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_nullptr>
                  ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
                   (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffe9b0);
        operator*<double,_Fad<double>,_nullptr>
                  ((double)CONCAT17(in_stack_ffffffffffffe9bf,in_stack_ffffffffffffe9b8),
                   in_stack_ffffffffffffe9b0);
        sin<FadBinaryMul<FadCst<double>,Fad<double>>>
                  ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
                   CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
        operator*<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_nullptr>
                  ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                    *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
                   (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffe9a0);
        operator-<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_double,_nullptr>
                  (e,dVar4);
        sin<double>((Fad<double> *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
        operator*<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadCst<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>,_nullptr>
                  ((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadCst<double>_>_>
                    *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
                   in_stack_ffffffffffffe9a0);
        TPZVec<Fad<double>_>::operator[](in_RDX,1);
        Fad<double>::operator=
                  (in_stack_ffffffffffffe990,
                   (FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadCst<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffe988);
        FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadCst<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadCst<double>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
                    *)in_stack_ffffffffffffe970);
        FadExpr<FadFuncSin<Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadFuncSin<Fad<double>_>_> *)in_stack_ffffffffffffe970);
        FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadCst<double>_>_>
        ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadCst<double>_>_>
                    *)in_stack_ffffffffffffe970);
        FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffe970);
        FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>::~FadExpr
                  ((FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffe970);
        FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe970
                  );
        FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffe970);
        FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>::~FadExpr
                  ((FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffe970);
        FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe970
                  );
      }
    }
    break;
  case 0xe:
    uVar2 = operator<<double,_double,_nullptr>
                      (in_stack_ffffffffffffe970,&in_stack_ffffffffffffe968->val_);
    if ((bool)uVar2) {
      operator*<double,_Fad<double>,_nullptr>
                ((double)CONCAT17(uVar2,in_stack_ffffffffffffe9b8),in_stack_ffffffffffffe9b0);
      operator*<double,_Fad<double>,_nullptr>
                ((double)CONCAT17(uVar2,in_stack_ffffffffffffe9b8),in_stack_ffffffffffffe9b0);
      operator/<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_double,_nullptr>
                ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe9c8,
                 in_stack_ffffffffffffe9c0);
      sin<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,Fad<double>>>,FadCst<double>>>
                ((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                  *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
      operator*<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_nullptr>
                ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
                 CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
                 (FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                  *)in_stack_ffffffffffffe9a0);
      operator-<double,_Fad<double>,_nullptr>
                ((double)CONCAT17(uVar2,in_stack_ffffffffffffe9b8),in_stack_ffffffffffffe9b0);
      sin<FadBinaryMinus<FadCst<double>,Fad<double>>>
                ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)
                 CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
      operator*<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_nullptr>
                ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>
                  *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
                 (FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffe9a0);
      TPZVec<Fad<double>_>::operator[](in_RDX,0);
      Fad<double>::operator=
                (in_stack_ffffffffffffe990,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffe988);
      FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffe970);
      FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>::~FadExpr
                ((FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffe970);
      FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe970
                );
      FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffe970);
      FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
      ::~FadExpr((FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                  *)in_stack_ffffffffffffe970);
      FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
      ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                  *)in_stack_ffffffffffffe970);
      FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe970);
      FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe970);
      pFVar6 = (Fad<double> *)(*(double *)(in_RDI + 0x28) * 0.25);
      operator*<double,_Fad<double>,_nullptr>
                ((double)CONCAT17(uVar2,in_stack_ffffffffffffe9b8),pFVar6);
      operator/<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_double,_nullptr>
                ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe9c8,
                 in_stack_ffffffffffffe9c0);
      cos<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,Fad<double>>>,FadCst<double>>>
                ((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                  *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
      operator*<double,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_nullptr>
                ((double)CONCAT17(uVar2,in_stack_ffffffffffffe9b8),
                 (FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                  *)pFVar6);
      Fad<double>::operator-(in_stack_ffffffffffffe978);
      operator-<double,_Fad<double>,_nullptr>
                ((double)CONCAT17(uVar2,in_stack_ffffffffffffe9b8),pFVar6);
      cos<FadBinaryMinus<FadCst<double>,Fad<double>>>
                ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)
                 CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
      operator*<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_nullptr>
                ((FadExpr<FadUnaryMin<Fad<double>_>_> *)
                 CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
                 (FadExpr<FadFuncCos<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffe9a0);
      operator-<double,_Fad<double>,_nullptr>
                ((double)CONCAT17(uVar2,in_stack_ffffffffffffe9b8),pFVar6);
      sin<FadBinaryMinus<FadCst<double>,Fad<double>>>
                ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)
                 CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8));
      operator+<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_nullptr>
                ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                  *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
                 (FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffe9a0);
      operator*<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_nullptr>
                ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>
                  *)CONCAT17(in_stack_ffffffffffffe9af,in_stack_ffffffffffffe9a8),
                 (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffe9a0);
      TPZVec<Fad<double>_>::operator[](in_RDX,1);
      Fad<double>::operator=
                (in_stack_ffffffffffffe990,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffe988);
      FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffe970);
      FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffe970);
      FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>::~FadExpr
                ((FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffe970);
      FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe970
                );
      FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffe970);
      FadExpr<FadFuncCos<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>::~FadExpr
                ((FadExpr<FadFuncCos<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_> *)
                 in_stack_ffffffffffffe970);
      FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe970
                );
      FadExpr<FadUnaryMin<Fad<double>_>_>::~FadExpr
                ((FadExpr<FadUnaryMin<Fad<double>_>_> *)0x1ea43c7);
      FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>
      ::~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffe970);
      FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
      ::~FadExpr((FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                  *)in_stack_ffffffffffffe970);
      FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
      ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                  *)in_stack_ffffffffffffe970);
      FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe970);
    }
    else {
      uVar3 = operator>=<double,_double,_nullptr>
                        (in_stack_ffffffffffffe970,&in_stack_ffffffffffffe968->val_);
      if ((bool)uVar3) {
        operator*<double,_Fad<double>,_nullptr>
                  ((double)CONCAT17(uVar2,in_stack_ffffffffffffe9b8),in_stack_ffffffffffffe9b0);
        operator/<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_double,_nullptr>
                  ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe9c8
                   ,in_stack_ffffffffffffe9c0);
        cos<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,Fad<double>>>,FadCst<double>>>
                  ((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                    *)CONCAT17(uVar3,in_stack_ffffffffffffe9a8));
        operator*<double,_Fad<double>,_nullptr>
                  ((double)CONCAT17(uVar2,in_stack_ffffffffffffe9b8),in_stack_ffffffffffffe9b0);
        operator/<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_double,_nullptr>
                  ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe9c8
                   ,in_stack_ffffffffffffe9c0);
        cos<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,Fad<double>>>,FadCst<double>>>
                  ((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                    *)CONCAT17(uVar3,in_stack_ffffffffffffe9a8));
        operator*<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_nullptr>
                  ((FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                    *)CONCAT17(uVar3,in_stack_ffffffffffffe9a8),
                   (FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                    *)in_stack_ffffffffffffe9a0);
        operator*<double,_Fad<double>,_nullptr>
                  ((double)CONCAT17(uVar2,in_stack_ffffffffffffe9b8),in_stack_ffffffffffffe9b0);
        operator/<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_double,_nullptr>
                  ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe9c8
                   ,in_stack_ffffffffffffe9c0);
        sin<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,Fad<double>>>,FadCst<double>>>
                  ((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                    *)CONCAT17(uVar3,in_stack_ffffffffffffe9a8));
        operator*<FadExpr<FadBinaryMul<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_nullptr>
                  ((FadExpr<FadBinaryMul<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>
                    *)CONCAT17(uVar3,in_stack_ffffffffffffe9a8),
                   (FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                    *)in_stack_ffffffffffffe9a0);
        TPZVec<Fad<double>_>::operator[](in_RDX,0);
        Fad<double>::operator=
                  (in_stack_ffffffffffffe990,
                   (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffe988);
        FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffe970);
        FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
        ::~FadExpr((FadExpr<FadFuncSin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                    *)in_stack_ffffffffffffe970);
        FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
        ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                    *)in_stack_ffffffffffffe970);
        FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe970
                  );
        FadExpr<FadBinaryMul<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffe970);
        FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
        ::~FadExpr((FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                    *)in_stack_ffffffffffffe970);
        FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
        ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                    *)in_stack_ffffffffffffe970);
        FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe970
                  );
        FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
        ::~FadExpr((FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                    *)in_stack_ffffffffffffe970);
        FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
        ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                    *)in_stack_ffffffffffffe970);
        FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe970
                  );
        operator*<double,_Fad<double>,_nullptr>
                  ((double)CONCAT17(uVar2,in_stack_ffffffffffffe9b8),in_stack_ffffffffffffe9b0);
        operator/<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_double,_nullptr>
                  ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe9c8
                   ,in_stack_ffffffffffffe9c0);
        cos<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,Fad<double>>>,FadCst<double>>>
                  ((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                    *)CONCAT17(uVar3,in_stack_ffffffffffffe9a8));
        ::operator-((FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                     *)in_stack_ffffffffffffe978);
        operator*<double,_Fad<double>,_nullptr>
                  ((double)CONCAT17(uVar2,in_stack_ffffffffffffe9b8),in_stack_ffffffffffffe9b0);
        sin<FadBinaryMul<FadCst<double>,Fad<double>>>
                  ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)
                   CONCAT17(uVar3,in_stack_ffffffffffffe9a8));
        operator*<double,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_nullptr>
                  ((double)CONCAT17(uVar2,in_stack_ffffffffffffe9b8),
                   (FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffe9b0);
        operator*<double,_Fad<double>,_nullptr>
                  ((double)CONCAT17(uVar2,in_stack_ffffffffffffe9b8),in_stack_ffffffffffffe9b0);
        operator/<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_double,_nullptr>
                  ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe9c8
                   ,in_stack_ffffffffffffe9c0);
        operator+<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>,_nullptr>
                  ((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                    *)CONCAT17(uVar3,in_stack_ffffffffffffe9a8),
                   (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                    *)in_stack_ffffffffffffe9a0);
        operator*<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_nullptr>
                  ((FadExpr<FadUnaryMin<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>
                    *)CONCAT17(uVar3,in_stack_ffffffffffffe9a8),
                   (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                    *)in_stack_ffffffffffffe9a0);
        TPZVec<Fad<double>_>::operator[](in_RDX,1);
        Fad<double>::operator=
                  (in_stack_ffffffffffffe990,
                   (FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffe988);
        FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffe970);
        FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                    *)in_stack_ffffffffffffe970);
        FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
        ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                    *)in_stack_ffffffffffffe970);
        FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe970
                  );
        FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffe970);
        FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>::~FadExpr
                  ((FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *)
                   in_stack_ffffffffffffe970);
        FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe970
                  );
        FadExpr<FadUnaryMin<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>
        ::~FadExpr((FadExpr<FadUnaryMin<FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>
                    *)0x1ea4af6);
        FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
        ::~FadExpr((FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                    *)in_stack_ffffffffffffe970);
        FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
        ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                    *)in_stack_ffffffffffffe970);
        FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)in_stack_ffffffffffffe970
                  );
      }
    }
  }
  Fad<double>::~Fad(in_stack_ffffffffffffe970);
  Fad<double>::~Fad(in_stack_ffffffffffffe970);
  Fad<double>::~Fad(in_stack_ffffffffffffe970);
  return;
}

Assistant:

void TStokesAnalytic::uxy(const TPZVec<TVar> &x, TPZVec<TVar> &flux) const
{
    TVar x1 = x[0];
    TVar x2 = x[1];
    TVar x3 = x[2];
    REAL Re = 0.;
    REAL lambda = 0.;
    REAL xs = 0.; 
    
    switch(fExactSol)
    {
        case ESinCos:
            flux[0] = -1.*sin(x1)*sin(x2);
            flux[1] = -1.*cos(x1)*cos(x2);
            break;
        case ENoFlow:
            flux[0] = x1*0.;
            flux[1] = x1*0.;
            break;
        case ESinCosBDS:
	    if(fvisco==0) xs = 0.;
	    xs = 1./exp(fcBrinkman/fvisco);
            flux[0] = -xs*sin(x1)*sin(x2)+(1.-xs)*sin(x1)*sin(x2);
            flux[1] = -xs*cos(x1)*cos(x2)-(1.-xs)*cos(x1)*cos(x2);
            break;
	case ECouplingSD:
	    if(x2<0.){
		flux[0] = (exp(-x2)-exp(x2))*cos(x1);
		flux[1] = -(exp(-x2)+exp(x2))*sin(x1);			
	    }else if(x2>=0.){
		flux[0] = (2./Pi)*sin(Pi*x2)*cos(Pi*x2)*cos(x1);
		flux[1] = ((1./(Pi*Pi))*sin(Pi*x2)*sin(Pi*x2)-2.)*sin(x1);	
	    }
	    break;
	case ECouplingNSD:
	    if(x2<1.){
		flux[0] = -(1./8.)*Pi*Pi*x2*sin(Pi*x1/2.)*sin(1.-x2);
		flux[1] = (1./4.)*Pi*cos(Pi*x1/2.)*(-x2*cos(1.-x2)+sin(1.-x2));			
	    }else if(x2>=1.){
	        flux[0] = cos(Pi*x2/2.)*cos(Pi*x2/2.)*sin(Pi*x1/2.);
	        flux[1] = -cos(Pi*x1/2.)*((1./4.)*sin(Pi*x2)+Pi*x2/4.);	
	    }
	    break;
	case ESinCosBDS3D:
	    xs = 1./exp(fcBrinkman/fvisco);
            flux[0] = -xs*sin(x1)*sin(x2)+(1.-xs)*sin(x1)*sin(x2);
            flux[1] = xs*(-cos(x1)*cos(x2)-sin(x2)*sin(x3))+(1.-xs)*(-cos(x1)*cos(x2)+sin(x2)*sin(x3));
            flux[2] = -xs*cos(x2)*cos(x3)+(1.-xs)*(-cos(x2)*cos(x3));
            break;
	case EGatica3D:
    	    flux[0] = cos(Pi*x1)*sin(Pi*x2)*sin(Pi*x3);
	    flux[1] = sin(Pi*x1)*cos(Pi*x2)*sin(Pi*x3);
	    flux[2] = -2.*sin(Pi*x1)*sin(Pi*x2)*cos(Pi*x3);
	break;
        case ESinCos3D:
            flux[0] = -sin(x1)*sin(x2);
            flux[1] = -cos(x1)*cos(x2)-sin(x2)*sin(x3);
            flux[2] = -cos(x2)*cos(x3);
            break;
        case EKovasznay:
        case EKovasznayCDG:
	    Re = 1./fvisco; //Reynolds number
            lambda = Re/2.- sqrt(Re*Re/4.+4.*Pi*Pi); // Parameter for Navier-Stokes solution
            flux[0] = 1. - exp(lambda*x1)*cos(2.*Pi*x2);
            flux[1] = (lambda/(2.*Pi))*exp(lambda*x1)*sin(2.*Pi*x2);
            break;
        case EPconst:
            flux[0] = x1;
            flux[1] = -x2;
            break;
        default:
            DebugStop();
    }
}